

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmeans_abstract.h
# Opt level: O0

void __thiscall AbstractKMeans<float>::showClusters(AbstractKMeans<float> *this)

{
  int iVar1;
  reference pvVar2;
  size_t sVar3;
  ostream *poVar4;
  size_t sVar5;
  Point<float> *this_00;
  size_type sVar6;
  float fVar7;
  Cluster<float> *cluster_1;
  int j_2;
  Cluster<float> *cluster;
  int j_1;
  int j;
  size_t total_points_cluster;
  int i;
  AbstractKMeans<float> *this_local;
  
  for (total_points_cluster._4_4_ = 0; (ulong)(long)total_points_cluster._4_4_ < this->K_;
      total_points_cluster._4_4_ = total_points_cluster._4_4_ + 1) {
    pvVar2 = std::vector<Cluster<float>,_std::allocator<Cluster<float>_>_>::operator[]
                       (&this->clusters_,(long)total_points_cluster._4_4_);
    sVar3 = Cluster<float>::getClusterSize(pvVar2);
    poVar4 = std::operator<<((ostream *)&std::cout,"Cluster ");
    pvVar2 = std::vector<Cluster<float>,_std::allocator<Cluster<float>_>_>::operator[]
                       (&this->clusters_,(long)total_points_cluster._4_4_);
    sVar5 = Cluster<float>::getID(pvVar2);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar5);
    std::operator<<(poVar4,"   \t");
    for (cluster._4_4_ = 0; (ulong)(long)cluster._4_4_ < sVar3; cluster._4_4_ = cluster._4_4_ + 1) {
      pvVar2 = std::vector<Cluster<float>,_std::allocator<Cluster<float>_>_>::operator[]
                         (&this->clusters_,(long)total_points_cluster._4_4_);
      this_00 = Cluster<float>::getPoint(pvVar2,cluster._4_4_);
      iVar1 = Point<float>::getID(this_00);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
      std::operator<<(poVar4," ");
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  std::operator<<((ostream *)&std::cout,"\n");
  std::operator<<((ostream *)&std::cout,"Radius : ");
  cluster._0_4_ = 0;
  while( true ) {
    sVar6 = std::vector<Cluster<float>,_std::allocator<Cluster<float>_>_>::size(&this->clusters_);
    if (sVar6 <= (ulong)(long)(int)cluster) break;
    pvVar2 = std::vector<Cluster<float>,_std::allocator<Cluster<float>_>_>::operator[]
                       (&this->clusters_,(long)(int)cluster);
    fVar7 = Cluster<float>::getRadius(pvVar2);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,fVar7);
    std::operator<<(poVar4," \t");
    cluster._0_4_ = (int)cluster + 1;
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"Size : ");
  cluster_1._4_4_ = 0;
  while( true ) {
    sVar6 = std::vector<Cluster<float>,_std::allocator<Cluster<float>_>_>::size(&this->clusters_);
    if (sVar6 <= (ulong)(long)cluster_1._4_4_) break;
    pvVar2 = std::vector<Cluster<float>,_std::allocator<Cluster<float>_>_>::operator[]
                       (&this->clusters_,(long)cluster_1._4_4_);
    sVar3 = Cluster<float>::getClusterSize(pvVar2);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,sVar3);
    std::operator<<(poVar4," \t");
    cluster_1._4_4_ = cluster_1._4_4_ + 1;
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void showClusters() {

        for(int i = 0; i < K_; i++) {

            size_t total_points_cluster =  clusters_[i].getClusterSize();

            cout << "Cluster " << clusters_[i].getID() << "   \t";

            for(int j = 0; j < total_points_cluster; j++) {
                cout << clusters_[i].getPoint(j).getID() << " ";
            }
            cout << endl;

        }
        cout << "\n";
        cout << "Radius : ";

        for (int j = 0; j < clusters_.size(); ++j) {
            Cluster<DataType>& cluster = clusters_[j];
            cout << cluster.getRadius() << " \t";
        }
        cout << endl;

        cout << "Size : ";

        for (int j = 0; j < clusters_.size(); ++j) {
            Cluster<DataType>& cluster = clusters_[j];
            cout << cluster.getClusterSize() << " \t";
        }
        cout << endl;
    }